

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

uint32_t ra_portable_header_size(roaring_array_t *ra)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uint8_t uVar5;
  bool bVar6;
  bool bVar7;
  
  iVar1 = ra->size;
  uVar2 = (ulong)iVar1;
  if (0 < (long)uVar2) {
    bVar6 = true;
    uVar4 = 1;
    do {
      uVar5 = ra->typecodes[uVar4 - 1];
      if (uVar5 == '\x04') {
        uVar5 = *(uint8_t *)((long)ra->containers[uVar4 - 1] + 8);
      }
      if (uVar5 == '\x03') break;
      bVar6 = uVar4 < uVar2;
      bVar7 = uVar4 != uVar2;
      uVar4 = uVar4 + 1;
    } while (bVar7);
    if (bVar6) {
      uVar3 = iVar1 + 7U >> 3;
      if (iVar1 < 4) {
        return uVar3 + iVar1 * 4 + 4;
      }
      return uVar3 + iVar1 * 8 + 4;
    }
  }
  return iVar1 * 8 + 8;
}

Assistant:

uint32_t ra_portable_header_size(const roaring_array_t *ra) {
    if (ra_has_run_container(ra)) {
        if (ra->size <
            NO_OFFSET_THRESHOLD) {  // for small bitmaps, we omit the offsets
            return 4 + (ra->size + 7) / 8 + 4 * ra->size;
        }
        return 4 + (ra->size + 7) / 8 +
               8 * ra->size;  // - 4 because we pack the size with the cookie
    } else {
        return 4 + 4 + 8 * ra->size;
    }
}